

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psocks.c
# Opt level: O0

void psocks_plug_log(Plug *plug,PlugLogType type,SockAddr *addr,int port,char *error_msg,
                    int error_code)

{
  _Bool _Var1;
  psocks_connection *conn_00;
  char local_148 [8];
  char addrbuf [256];
  psocks_connection *conn;
  int error_code_local;
  char *error_msg_local;
  int port_local;
  SockAddr *addr_local;
  PlugLogType type_local;
  Plug *plug_local;
  
  conn_00 = (psocks_connection *)(plug + -10);
  if ((conn_00->ps->log_flags & 1) != 0) {
    switch(type) {
    case PLUGLOG_CONNECT_TRYING:
      sk_getaddr(addr,local_148,0x100);
      _Var1 = sk_addr_needs_port(addr);
      if (_Var1) {
        psocks_conn_log(conn_00,"trying to connect to %s port %d",local_148,(ulong)(uint)port);
      }
      else {
        psocks_conn_log(conn_00,"trying to connect to %s",local_148);
      }
      break;
    case PLUGLOG_CONNECT_FAILED:
      psocks_conn_log(conn_00,"connection attempt failed: %s",error_msg);
      break;
    case PLUGLOG_CONNECT_SUCCESS:
      psocks_conn_log(conn_00,"connection established",error_msg);
      if (((ulong)plug[-3].vt & 1) != 0) {
        chan_open_confirmation((Channel *)plug[-9].vt);
        *(undefined1 *)&plug[-3].vt = 0;
      }
      break;
    case PLUGLOG_PROXY_MSG:
      psocks_conn_log(conn_00,"connection setup: %s",error_msg);
    }
  }
  return;
}

Assistant:

static void psocks_plug_log(Plug *plug, PlugLogType type, SockAddr *addr,
                            int port, const char *error_msg, int error_code)
{
    psocks_connection *conn = container_of(plug, psocks_connection, plug);
    char addrbuf[256];

    if (!(conn->ps->log_flags & LOG_CONNSTATUS))
        return;

    switch (type) {
      case PLUGLOG_CONNECT_TRYING:
        sk_getaddr(addr, addrbuf, sizeof(addrbuf));
        if (sk_addr_needs_port(addr))
            psocks_conn_log(conn, "trying to connect to %s port %d",
                            addrbuf, port);
        else
            psocks_conn_log(conn, "trying to connect to %s", addrbuf);
        break;
      case PLUGLOG_CONNECT_FAILED:
        psocks_conn_log(conn, "connection attempt failed: %s", error_msg);
        break;
      case PLUGLOG_CONNECT_SUCCESS:
        psocks_conn_log(conn, "connection established", error_msg);
        if (conn->connecting) {
            chan_open_confirmation(conn->chan);
            conn->connecting = false;
        }
        break;
      case PLUGLOG_PROXY_MSG:
        psocks_conn_log(conn, "connection setup: %s", error_msg);
        break;
    };
}